

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkinformation.cpp
# Opt level: O0

QStringList * QNetworkInformationPrivate::backendNames(void)

{
  long lVar1;
  bool bVar2;
  Type *pTVar3;
  QMutexLocker<QMutex> *in_RDI;
  long in_FS_OFFSET;
  QNetworkInformationBackendFactory *factory;
  QList<QNetworkInformationBackendFactory_*> *__range1;
  QStringList *result;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QNetworkInformationBackendFactory_*> copy;
  QMutexLocker<QMutex> locker;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>
  *in_stack_ffffffffffffff68;
  QMutexLocker<QMutex> *this;
  QMutexLocker<QMutex> *this_00;
  undefined1 local_60 [24];
  QNetworkInformationBackendFactory **local_48;
  const_iterator local_40;
  const_iterator local_38;
  Data *local_30;
  QNetworkInformationBackendFactory **ppQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  this_00 = in_RDI;
  pTVar3 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::
           operator()(in_stack_ffffffffffffff68);
  if (pTVar3 == (Type *)0x0) {
    memset(this,0,0x18);
    QList<QString>::QList((QList<QString> *)0x23137b);
  }
  else {
    bVar2 = initializeList();
    if (bVar2) {
      QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::operator->
                ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_> *)
                 0x2313d3);
      QMutexLocker<QMutex>::QMutexLocker(this,(QMutex *)in_stack_ffffffffffffff68);
      local_30 = (Data *)0xaaaaaaaaaaaaaaaa;
      ppQVar4 = (QNetworkInformationBackendFactory **)0xaaaaaaaaaaaaaaaa;
      QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::operator->
                ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_> *)
                 0x231413);
      QList<QNetworkInformationBackendFactory_*>::QList
                ((QList<QNetworkInformationBackendFactory_*> *)this,
                 (QList<QNetworkInformationBackendFactory_*> *)in_stack_ffffffffffffff68);
      QMutexLocker<QMutex>::unlock(this);
      this->m_mutex = (QMutex *)0xaaaaaaaaaaaaaaaa;
      *(undefined8 *)&this->m_isLocked = 0xaaaaaaaaaaaaaaaa;
      this[1].m_mutex = (QMutex *)0xaaaaaaaaaaaaaaaa;
      QList<QString>::QList((QList<QString> *)0x231460);
      QList<QNetworkInformationBackendFactory_*>::size
                ((QList<QNetworkInformationBackendFactory_*> *)&local_30);
      QList<QString>::reserve((QList<QString> *)this_00,(qsizetype)ppQVar4);
      local_38.i = (QNetworkInformationBackendFactory **)0xaaaaaaaaaaaaaaaa;
      local_38 = QList<QNetworkInformationBackendFactory_*>::begin
                           ((QList<QNetworkInformationBackendFactory_*> *)this);
      local_40.i = (QNetworkInformationBackendFactory **)0xaaaaaaaaaaaaaaaa;
      local_40 = QList<QNetworkInformationBackendFactory_*>::end
                           ((QList<QNetworkInformationBackendFactory_*> *)this);
      while( true ) {
        local_48 = local_40.i;
        bVar2 = QList<QNetworkInformationBackendFactory_*>::const_iterator::operator!=
                          (&local_38,local_40);
        if (!bVar2) break;
        ppQVar4 = QList<QNetworkInformationBackendFactory_*>::const_iterator::operator*(&local_38);
        (**(code **)(*(long *)*ppQVar4 + 0x60))(local_60);
        QList<QString>::operator<<((QList<QString> *)this,(rvalue_ref)in_stack_ffffffffffffff68);
        QString::~QString((QString *)0x231520);
        QList<QNetworkInformationBackendFactory_*>::const_iterator::operator++(&local_38);
      }
      QList<QNetworkInformationBackendFactory_*>::~QList
                ((QList<QNetworkInformationBackendFactory_*> *)0x23154c);
      QMutexLocker<QMutex>::~QMutexLocker(this);
    }
    else {
      memset(this,0,0x18);
      QList<QString>::QList((QList<QString> *)0x2313a4);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QStringList *)in_RDI;
}

Assistant:

QStringList QNetworkInformationPrivate::backendNames()
{
    if (!dataHolder())
        return {};
    if (!initializeList())
        return {};

    QMutexLocker locker(&dataHolder->instanceMutex);
    const QList copy = dataHolder->factories;
    locker.unlock();

    QStringList result;
    result.reserve(copy.size());
    for (const auto *factory : copy)
        result << factory->name();
    return result;
}